

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

int __thiscall Logger::init(Logger *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  size_t sVar3;
  invalid_argument *this_00;
  buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  thread *this_02;
  char *pcVar4;
  FILE *pFVar5;
  log_level in_ECX;
  int in_EDX;
  int in_R8D;
  int in_R9D;
  my_time mVar6;
  char local_188 [8];
  char log_file_fullname [268];
  char *p;
  int local_60;
  char cStack_50;
  char cStack_4f;
  my_time tm;
  int split_lines_local;
  int buffer_size_local;
  log_level level_local;
  int buffer_queue_size_local;
  char *file_name_local;
  Logger *this_local;
  ulong uVar2;
  
  if ((this->l_inited & 1U) == 0) {
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      this->l_is_stdout = true;
    }
    if ((this->l_is_stdout & 1U) == 0) {
      sVar3 = strlen((char *)ctx);
      if (0x7f < sVar3) {
        if (-1 < pr_level) {
          printf("[%-5s][%s:%d] file name must be less than 128 bytes!\n","error","init",0x5b);
        }
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"file name must be less than 128 bytes!");
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
    }
    set_log_level(in_ECX);
    if (0 < in_EDX) {
      this->l_is_async = true;
      this_01 = (buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)operator_new(0x88);
      buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::buffer_queue(this_01,in_EDX,false);
      this->l_buffer_queue = this_01;
      this_02 = (thread *)operator_new(8);
      tm._4_8_ = async_flush;
      std::thread::thread<void(*)(),,void>(this_02,(_func_void **)&tm.month);
      this->l_asyncw_thread = this_02;
    }
    this->l_buf_size = in_R8D;
    pcVar4 = (char *)operator_new__((long)this->l_buf_size);
    this->l_buf = pcVar4;
    memset(this->l_buf,0,(long)this->l_buf_size);
    this->l_split_lines = in_R9D;
    mVar6 = get_current_sys_time();
    local_60 = CONCAT31(local_60._1_3_,mVar6.second);
    tm.year = local_60;
    cStack_4f = mVar6.day;
    this->l_today = (int)cStack_4f;
    if ((this->l_is_stdout & 1U) == 0) {
      pcVar4 = strrchr((char *)ctx,0x2f);
      memset(local_188,0,0x10c);
      if (pcVar4 == (char *)0x0) {
        uVar2 = 0;
        if (-1 < pr_level) {
          uVar1 = printf("[%-5s][%s:%d] log file name should behind \'/\'\n","error","init",0x7f);
          uVar2 = (ulong)uVar1;
        }
        this_local._7_1_ = 0;
      }
      else {
        strcpy(this->l_file_name,pcVar4 + 1);
        strncpy(this->l_dir_name,(char *)ctx,(size_t)(pcVar4 + (1 - (long)ctx)));
        cStack_50 = mVar6.month;
        snprintf(local_188,0x10b,"%s%04d_%02d_%02d_%s",this,mVar6._0_8_ & 0xffffffff,
                 (ulong)(uint)(int)cStack_50,(int)cStack_4f,this->l_file_name);
        pFVar5 = fopen(local_188,"a");
        this->l_fp = (FILE *)pFVar5;
        if (this->l_fp == (FILE *)0x0) {
          uVar2 = 0;
          if (-1 < pr_level) {
            uVar1 = printf("[%-5s][%s:%d] open %s failed!\n","error","init",0x8e,local_188);
            uVar2 = (ulong)uVar1;
          }
          this_local._7_1_ = 0;
        }
        else {
          this->l_inited = true;
          if (2 < pr_level) {
            printf("[%-5s][%s:%d] succeed in using file %s as log output\n","debug","init",0x93,
                   local_188);
          }
          uVar2 = 0;
          if (2 < pr_level) {
            uVar1 = printf("[%-5s][%s:%d] log init finished!\n","debug","init",0x94);
            uVar2 = (ulong)uVar1;
          }
          this_local._7_1_ = 1;
        }
      }
    }
    else {
      this->l_inited = true;
      this->l_fp = _stdout;
      if (2 < pr_level) {
        printf("[%-5s][%s:%d] succeed in using stdout as log output\n","debug","init",0x75);
      }
      uVar2 = 0;
      if (2 < pr_level) {
        uVar1 = printf("[%-5s][%s:%d] log init finished!\n","debug","init",0x76);
        uVar2 = (ulong)uVar1;
      }
      this_local._7_1_ = 1;
    }
  }
  else {
    uVar2 = 0;
    if (0 < pr_level) {
      uVar1 = printf("[%-5s][%s:%d] Logger has been initialized, do not try again!\n","warn","init",
                     0x50);
      uVar2 = (ulong)uVar1;
    }
    this_local._7_1_ = 0;
  }
  return (int)CONCAT71((int7)(uVar2 >> 8),this_local._7_1_);
}

Assistant:

bool Logger::init(const char *file_name, int buffer_queue_size, 
                    Logger::log_level level, int buffer_size, int split_lines)
{
    if(l_inited)
    {
        PR_WARN("Logger has been initialized, do not try again!\n");
        return false;
    }

    if(!file_name)
    {
        l_is_stdout = true;
    }

    if( !l_is_stdout && strlen(file_name)>=128 )
    {
        PR_ERROR("file name must be less than 128 bytes!\n");
        // exit(-1);
        throw invalid_argument("file name must be less than 128 bytes!");;
    }

    set_log_level(level);

    if (buffer_queue_size >= 1)
    {
        l_is_async = true;
        l_buffer_queue = new buffer_queue<string>(buffer_queue_size);
        l_asyncw_thread = new thread(&Logger::async_flush);
    }
    
    l_buf_size = buffer_size;
    l_buf = new char[l_buf_size];
    memset(l_buf, '\0', l_buf_size);
    l_split_lines = split_lines;

    my_time tm = get_current_sys_time();
    l_today = tm.day;
 
    if(l_is_stdout)
    {
        l_inited = true;
        l_fp = stdout;
        PR_DEBUG("succeed in using stdout as log output\n");
        PR_DEBUG("log init finished!\n");
        return true;
    }

    const char *p = strrchr(file_name, '/');
    char log_file_fullname[268] = {0};

    if (p == NULL)
    {
        PR_ERROR("log file name should behind '/'\n");
        return false;
    }
    else
    {
        strcpy(l_file_name, p + 1);
        strncpy(l_dir_name, file_name, p - file_name + 1);
        snprintf(log_file_fullname, 267, "%s%04d_%02d_%02d_%s", l_dir_name, 
            tm.year, tm.month, tm.day, l_file_name);
    
        l_fp = fopen(log_file_fullname, "a");
    }

    if (l_fp == NULL)
    {
        PR_ERROR("open %s failed!\n", log_file_fullname);
        return false;
    }

    l_inited = true;
    PR_DEBUG("succeed in using file %s as log output\n", log_file_fullname);
    PR_DEBUG("log init finished!\n");

    return true;
}